

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O3

bool __thiscall FPlayerNameBox::MenuEvent(FPlayerNameBox *this,int mkey,bool fromcontroller)

{
  DTextEnterMenu *this_00;
  FSoundID local_1c;
  
  if (mkey != 0xb) {
    if (mkey != 10) {
      if (mkey == 6) {
        local_1c.ID = S_FindSound("menu/choose");
        S_Sound(0x22,&local_1c,snd_menuvolume.Value,0.0);
        strcpy(this->mEditName,this->mPlayerName);
        this->mEntering = true;
        this_00 = (DTextEnterMenu *)
                  M_Malloc_Dbg(0x58,
                               "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                               ,0x1f7);
        DTextEnterMenu::DTextEnterMenu
                  (this_00,DMenu::CurrentMenu,this->mEditName,0xf,2,fromcontroller,false);
        M_ActivateMenu((DMenu *)this_00);
        return true;
      }
      return false;
    }
    strcpy(this->mPlayerName,this->mEditName);
  }
  this->mEntering = false;
  return true;
}

Assistant:

bool FPlayerNameBox::MenuEvent(int mkey, bool fromcontroller)
{
	if (mkey == MKEY_Enter)
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/choose", snd_menuvolume, ATTN_NONE);
		strcpy(mEditName, mPlayerName);
		mEntering = true;
		DMenu *input = new DTextEnterMenu(DMenu::CurrentMenu, mEditName, MAXPLAYERNAME, 2, fromcontroller);
		M_ActivateMenu(input);
		return true;
	}
	else if (mkey == MKEY_Input)
	{
		strcpy(mPlayerName, mEditName);
		mEntering = false;
		return true;
	}
	else if (mkey == MKEY_Abort)
	{
		mEntering = false;
		return true;
	}
	return false;
}